

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

bool __thiscall
wabt::Decompiler::CheckImportExport
          (Decompiler *this,string *s,ExternalKind kind,Index index,string_view name)

{
  Module *this_00;
  string_view name_00;
  bool bVar1;
  Export *pEVar2;
  bool is_export;
  Export *xport;
  Var local_80;
  byte local_31;
  Index local_30;
  ExternalKind EStack_2c;
  bool is_import;
  Index index_local;
  ExternalKind kind_local;
  string *s_local;
  Decompiler *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (Decompiler *)name.data_;
  this_00 = (this->mc).module;
  local_30 = index;
  EStack_2c = kind;
  _index_local = s;
  s_local = (string *)this;
  Location::Location((Location *)&xport);
  Var::Var(&local_80,index,(Location *)&xport);
  bVar1 = Module::IsImport(this_00,kind,&local_80);
  Var::~Var(&local_80);
  name_00.size_ = (size_type)name_local.data_;
  name_00.data_ = (char *)this_local;
  local_31 = bVar1;
  pEVar2 = Module::GetExport((this->mc).module,name_00);
  bVar1 = false;
  if (pEVar2 != (Export *)0x0) {
    bVar1 = pEVar2->kind == EStack_2c;
  }
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)_index_local,"export ");
  }
  if ((local_31 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)_index_local,"import ");
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool CheckImportExport(std::string& s,
                         ExternalKind kind,
                         Index index,
                         string_view name) {
    // Figure out if this thing is imported, exported, or neither.
    auto is_import = mc.module.IsImport(kind, Var(index));
    // TODO: is this the best way to check for export?
    // FIXME: this doesn't work for functions that get renamed in some way,
    // as the export has the original name..
    auto xport = mc.module.GetExport(name);
    auto is_export = xport && xport->kind == kind;
    if (is_export)
      s += "export ";
    if (is_import)
      s += "import ";
    return is_import;
  }